

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_chain_methods<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,false,false,false>>>*>>>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  Index IVar3;
  uint uVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3f8;
  assertion_result local_3d8;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_380;
  assertion_result local_360;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  basic_cstring<const_char> local_328;
  basic_cstring<const_char> local_318;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_308;
  assertion_result local_2e8;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_290;
  assertion_result local_270;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_218;
  assertion_result local_1f8;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a0;
  assertion_result local_180;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_128;
  assertion_result local_108;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b0;
  assertion_result local_90;
  basic_cstring<const_char> local_78 [2];
  basic_cstring<const_char> local_58;
  undefined1 local_48 [8];
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  col;
  Column_settings settings;
  
  Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>
  ::Column_z2_settings::Column_z2_settings((Column_z2_settings *)((long)&col.entryPool_ + 7),5);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_48,(Column_settings *)((long)&col.entryPool_ + 7));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_58,0x3f4,local_78);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                         *)(local_48 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_90,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,"!col.is_paired()",0x10);
    boost::unit_test::operator<<(&local_b0,plVar5,&local_c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_90,&local_b0,&local_d0,0x3f4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b0);
    boost::test_tools::assertion_result::~assertion_result(&local_90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e0,0x3f5,&local_f0);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                        *)(local_48 + 4));
    uVar4 = Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>
            ::get_null_value<unsigned_int>();
    boost::test_tools::assertion_result::assertion_result(&local_108,IVar3 == uVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
               ,0x61);
    boost::unit_test::operator<<(&local_128,plVar5,&local_138);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_108,&local_128,&local_148,0x3f5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_128);
    boost::test_tools::assertion_result::~assertion_result(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
  ::unassign_paired_chain
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
              *)(local_48 + 4));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x3f8,&local_168);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                         *)(local_48 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_180,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,"!col.is_paired()",0x10);
    boost::unit_test::operator<<(&local_1a0,plVar5,&local_1b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_180,&local_1a0,&local_1c0,0x3f8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1a0);
    boost::test_tools::assertion_result::~assertion_result(&local_180);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d0,0x3f9,&local_1e0);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                        *)(local_48 + 4));
    uVar4 = Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>
            ::get_null_value<unsigned_int>();
    boost::test_tools::assertion_result::assertion_result(&local_1f8,IVar3 == uVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,
               "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
               ,0x61);
    boost::unit_test::operator<<(&local_218,plVar5,&local_228);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1f8,&local_218,&local_238,0x3f9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_218);
    boost::test_tools::assertion_result::~assertion_result(&local_1f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
  ::assign_paired_chain
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
              *)(local_48 + 4),2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_258);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x3fc,&local_258);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                         *)(local_48 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_270,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,"col.is_paired()",0xf);
    boost::unit_test::operator<<(&local_290,plVar5,&local_2a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_270,&local_290,&local_2b0,0x3fc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_290);
    boost::test_tools::assertion_result::~assertion_result(&local_270);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2c0,0x3fd,&local_2d0);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                        *)(local_48 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_2e8,IVar3 == 2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,"col.get_paired_chain_index() == 2",0x21);
    boost::unit_test::operator<<(&local_308,plVar5,&local_318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2e8,&local_308,&local_328,0x3fd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_308);
    boost::test_tools::assertion_result::~assertion_result(&local_2e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
  ::unassign_paired_chain
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
              *)(local_48 + 4));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_348);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_338,0x400,&local_348);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                         *)(local_48 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_360,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,"!col.is_paired()",0x10);
    boost::unit_test::operator<<(&local_380,plVar5,&local_390);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_360,&local_380,&local_3a0,0x400,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_380);
    boost::test_tools::assertion_result::~assertion_result(&local_360);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0x401,&local_3c0);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>
                        *)(local_48 + 4));
    uVar4 = Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>
            ::get_null_value<unsigned_int>();
    boost::test_tools::assertion_result::assertion_result(&local_3d8,IVar3 == uVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,
               "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
               ,0x61);
    boost::unit_test::operator<<(&local_3f8,plVar5,&local_408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3d8,&local_3f8,&local_418,0x401,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3f8);
    boost::test_tools::assertion_result::~assertion_result(&local_3d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_false,_false,_false>_>_>_*>_>_>
              *)local_48);
  return;
}

Assistant:

void column_test_chain_methods() {
  typename Column::Column_settings settings(5);

  Column col(&settings);

  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());

  col.unassign_paired_chain();
  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());

  col.assign_paired_chain(2);
  BOOST_CHECK(col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == 2);

  col.unassign_paired_chain();
  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());
}